

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

Au_Ntk_t * Au_NtkAlloc(Au_Man_t *pMan,char *pName)

{
  Au_Ntk_t *p;
  size_t sVar1;
  char *__dest;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int *piVar4;
  
  p = (Au_Ntk_t *)calloc(1,0x100);
  if (pName == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar1 = strlen(pName);
    __dest = (char *)malloc(sVar1 + 1);
    strcpy(__dest,pName);
  }
  p->pName = __dest;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 0x6f;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x378);
  pVVar2->pArray = ppvVar3;
  p->vChunks = pVVar2;
  if ((p->vPis).nCap < 0x6f) {
    piVar4 = (p->vPis).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(0x1bc);
    }
    else {
      piVar4 = (int *)realloc(piVar4,0x1bc);
    }
    (p->vPis).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_0086034e;
    (p->vPis).nCap = 0x6f;
  }
  if ((p->vPos).nCap < 0x6f) {
    piVar4 = (p->vPos).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(0x1bc);
    }
    else {
      piVar4 = (int *)realloc(piVar4,0x1bc);
    }
    (p->vPos).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_0086034e;
    (p->vPos).nCap = 0x6f;
  }
  if ((p->vObjs).nCap < 0x457) {
    piVar4 = (p->vObjs).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(0x115c);
    }
    else {
      piVar4 = (int *)realloc(piVar4,0x115c);
    }
    (p->vObjs).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_0086034e:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vObjs).nCap = 0x457;
  }
  if ((p->vPages).nCap < 0xb) {
    ppvVar3 = (p->vPages).pArray;
    if (ppvVar3 == (void **)0x0) {
      ppvVar3 = (void **)malloc(0x58);
    }
    else {
      ppvVar3 = (void **)realloc(ppvVar3,0x58);
    }
    (p->vPages).pArray = ppvVar3;
    (p->vPages).nCap = 0xb;
  }
  Au_ManAddNtk(pMan,p);
  return p;
}

Assistant:

Au_Ntk_t * Au_NtkAlloc( Au_Man_t * pMan, char * pName )
{
    Au_Ntk_t * p;
    p = ABC_CALLOC( Au_Ntk_t, 1 );
    p->pName = Au_UtilStrsav( pName );
    p->vChunks = Vec_PtrAlloc( 111 );
    Vec_IntGrow( &p->vPis,  111 );
    Vec_IntGrow( &p->vPos,  111 );
    Vec_IntGrow( &p->vObjs, 1111 );
    Vec_PtrGrow( &p->vPages, 11 );
    Au_ManAddNtk( pMan, p );
    return p;
}